

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_ldrddi.cpp
# Opt level: O0

ze_result_t
loader::zeEventQueryKernelTimestamp(ze_event_handle_t hEvent,ze_kernel_timestamp_result_t *dstptr)

{
  ze_pfnEventQueryKernelTimestamp_t pfnQueryKernelTimestamp;
  dditable_t *dditable;
  ze_result_t result;
  ze_kernel_timestamp_result_t *dstptr_local;
  ze_event_handle_t hEvent_local;
  
  if (*(code **)(*(long *)(hEvent + 8) + 0x4c8) == (code *)0x0) {
    hEvent_local._4_4_ = ZE_RESULT_ERROR_UNINITIALIZED;
  }
  else {
    hEvent_local._4_4_ = (**(code **)(*(long *)(hEvent + 8) + 0x4c8))(*(undefined8 *)hEvent,dstptr);
  }
  return hEvent_local._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeEventQueryKernelTimestamp(
        ze_event_handle_t hEvent,                       ///< [in] handle of the event
        ze_kernel_timestamp_result_t* dstptr            ///< [in,out] pointer to memory for where timestamp result will be written.
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // extract driver's function pointer table
        auto dditable = reinterpret_cast<ze_event_object_t*>( hEvent )->dditable;
        auto pfnQueryKernelTimestamp = dditable->ze.Event.pfnQueryKernelTimestamp;
        if( nullptr == pfnQueryKernelTimestamp )
            return ZE_RESULT_ERROR_UNINITIALIZED;

        // convert loader handle to driver handle
        hEvent = reinterpret_cast<ze_event_object_t*>( hEvent )->handle;

        // forward to device-driver
        result = pfnQueryKernelTimestamp( hEvent, dstptr );

        return result;
    }